

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

int getCursorPosition(int ifd,int ofd)

{
  int iVar1;
  ssize_t sVar2;
  int iVar3;
  long lVar4;
  int cols;
  int rows;
  char buf [32];
  int local_50;
  undefined1 local_4c [4];
  char local_48 [40];
  
  sVar2 = write(ofd,"\x1b[6n",4);
  iVar3 = -1;
  if (sVar2 == 4) {
    lVar4 = 0;
    do {
      sVar2 = read(ifd,local_48 + lVar4,1);
      if ((sVar2 != 1) || (local_48[lVar4] == 'R')) goto LAB_00133cdd;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x1f);
    lVar4 = 0x1f;
LAB_00133cdd:
    local_48[lVar4] = '\0';
    if ((local_48[0] == '\x1b') && (local_48[1] == '[')) {
      iVar1 = __isoc99_sscanf(local_48 + 2,"%d;%d",local_4c,&local_50);
      iVar3 = -1;
      if (iVar1 == 2) {
        iVar3 = local_50;
      }
    }
  }
  return iVar3;
}

Assistant:

static int getCursorPosition(int ifd, int ofd) {
    char buf[32];
    int cols, rows;
    unsigned int i = 0;

    /* Report cursor location */
    if (write(ofd, "\x1b[6n", 4) != 4) return -1;

    /* Read the response: ESC [ rows ; cols R */
    while (i < sizeof(buf)-1) {
        if (read(ifd,buf+i,1) != 1) break;
        if (buf[i] == 'R') break;
        i++;
    }
    buf[i] = '\0';

    /* Parse it. */
    if (buf[0] != ESC || buf[1] != '[') return -1;
    if (sscanf(buf+2,"%d;%d",&rows,&cols) != 2) return -1;
    return cols;
}